

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O0

char * __thiscall
fmt::v10::formatter<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_char,_void>::
parse(formatter<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_char,_void> *this
     ,format_parse_context *ctx)

{
  bool bVar1;
  int iVar2;
  iterator pcVar3;
  char *begin;
  format_error *this_00;
  char *start;
  char *end;
  char *it;
  format_parse_context *ctx_local;
  formatter<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_char,_void>
  *this_local;
  
  end = basic_format_parse_context<char>::begin(ctx);
  pcVar3 = basic_format_parse_context<char>::end(ctx);
  if ((end == pcVar3) || (*end != '.')) {
    this->precision = 4;
  }
  else {
    begin = end + 1;
    for (end = begin; bVar1 = is_digit(this,*end), bVar1 && end != pcVar3; end = end + 1) {
    }
    iVar2 = parse_unsigned_int(this,begin,end);
    this->precision = iVar2;
  }
  if ((end != pcVar3) && (*end != '}')) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::runtime_error(this_00,"invalid format");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  return end;
}

Assistant:

constexpr auto parse(const format_parse_context& ctx) {
    const auto* it = ctx.begin();
    const auto* end = ctx.end();

    if (it != end && *it == '.') {
      // Support precision:
      ++it;
      auto start = it;
      while (is_digit(*it) && it != end) {
        ++it;
      }
      precision = parse_unsigned_int(start, it);
    } else {
      precision = 4;
    }

    if (it != end && *it != '}') {
      throw format_error("invalid format");
    }

    return it;
  }